

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlSubstitutionItem::LhsPrettyPrint
          (GdlSubstitutionItem *this,GrcManager *param_1,GdlRule *param_2,int param_3,
          ostream *strmOut,bool param_5)

{
  string local_30;
  
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_
            (&local_30,(this->super_GdlSetAttrItem).super_GdlRuleItem.m_psymInput);
  std::operator<<(strmOut,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::operator<<(strmOut,"  ");
  return;
}

Assistant:

void GdlSubstitutionItem::LhsPrettyPrint(GrcManager * /*pcman*/, GdlRule * /*prule*/, int /*irit*/,
	std::ostream & strmOut, bool /*fXml*/)
{
	strmOut << m_psymInput->FullAbbrev();
	strmOut << "  ";
}